

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
basic_json_encoder(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
                   *this,stream_sink<wchar_t> *sink,basic_json_encode_options<wchar_t> *options,
                  allocator<char> *alloc)

{
  spaces_option sVar1;
  undefined8 local_94;
  undefined4 local_8c;
  wstring *local_88;
  wstring *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  wstring *local_58;
  wstring *local_50;
  write_double *local_48;
  basic_json_encode_options<wchar_t> *local_40;
  stream_sink<wchar_t> *local_38;
  
  (this->super_basic_json_visitor<wchar_t>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_encoder_009b1270;
  local_38 = &this->sink_;
  stream_sink<wchar_t>::stream_sink(local_38,sink);
  basic_json_encode_options<wchar_t>::basic_json_encode_options(&this->options_,options);
  local_48 = &this->fp_;
  local_40 = &this->options_;
  detail::write_double::write_double(local_48,options->float_format_,(int)options->precision_);
  this->column_ = 0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->colon_str_)._M_dataplus._M_p = (pointer)&(this->colon_str_).field_2;
  (this->colon_str_)._M_string_length = 0;
  (this->colon_str_).field_2._M_local_buf[0] = L'\0';
  (this->comma_str_)._M_dataplus._M_p = (pointer)&(this->comma_str_).field_2;
  (this->comma_str_)._M_string_length = 0;
  (this->comma_str_).field_2._M_local_buf[0] = L'\0';
  local_80 = (wstring *)&this->colon_str_;
  local_88 = (wstring *)&this->comma_str_;
  local_50 = (wstring *)&this->open_object_brace_str_;
  (this->open_object_brace_str_)._M_dataplus._M_p = (pointer)&(this->open_object_brace_str_).field_2
  ;
  (this->open_object_brace_str_)._M_string_length = 0;
  (this->open_object_brace_str_).field_2._M_local_buf[0] = L'\0';
  (this->close_object_brace_str_)._M_dataplus._M_p =
       (pointer)&(this->close_object_brace_str_).field_2;
  (this->close_object_brace_str_)._M_string_length = 0;
  (this->close_object_brace_str_).field_2._M_local_buf[0] = L'\0';
  (this->open_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->open_array_bracket_str_).field_2;
  (this->open_array_bracket_str_)._M_string_length = 0;
  (this->open_array_bracket_str_).field_2._M_local_buf[0] = L'\0';
  (this->close_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->close_array_bracket_str_).field_2;
  (this->close_array_bracket_str_)._M_string_length = 0;
  local_58 = (wstring *)&this->close_object_brace_str_;
  (this->close_array_bracket_str_).field_2._M_local_buf[0] = L'\0';
  this->nesting_depth_ = 0;
  sVar1 = options->spaces_around_colon_;
  if (sVar1 == space_after) {
    local_94 = 0x200000003a;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
LAB_0047eb0a:
    std::__cxx11::wstring::operator=(local_80,(wstring *)local_78);
    std::__cxx11::wstring::~wstring((wstring *)local_78);
  }
  else {
    if (sVar1 == space_before) {
      local_94 = 0x3a00000020;
      local_78[0] = local_68;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
      goto LAB_0047eb0a;
    }
    if (sVar1 == space_before_and_after) {
      local_94 = 0x3a00000020;
      local_8c = 0x20;
      local_78[0] = local_68;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
      goto LAB_0047eb0a;
    }
    std::__cxx11::wstring::push_back((wchar_t)local_80);
  }
  sVar1 = options->spaces_around_comma_;
  if (sVar1 == space_before_and_after) {
    local_94 = 0x2c00000020;
    local_8c = 0x20;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
  }
  else if (sVar1 == space_before) {
    local_94 = 0x2c00000020;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
  }
  else {
    if (sVar1 != space_after) {
      std::__cxx11::wstring::push_back((wchar_t)local_88);
      goto LAB_0047ebed;
    }
    local_94 = 0x200000002c;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
  }
  std::__cxx11::wstring::operator=(local_88,(wstring *)local_78);
  std::__cxx11::wstring::~wstring((wstring *)local_78);
LAB_0047ebed:
  if ((options->field_0x8 & 4) == 0) {
    std::__cxx11::wstring::push_back((wchar_t)local_50);
    std::__cxx11::wstring::push_back((wchar_t)local_58);
  }
  else {
    local_94 = 0x200000007b;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
    std::__cxx11::wstring::operator=(local_50,(wstring *)local_78);
    std::__cxx11::wstring::~wstring((wstring *)local_78);
    local_94 = 0x7d00000020;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
    std::__cxx11::wstring::operator=(local_58,(wstring *)local_78);
    std::__cxx11::wstring::~wstring((wstring *)local_78);
  }
  if ((options->field_0x8 & 8) == 0) {
    std::__cxx11::wstring::push_back((wchar_t)&this->open_array_bracket_str_);
    std::__cxx11::wstring::push_back((wchar_t)&this->close_array_bracket_str_);
  }
  else {
    local_94 = 0x200000005b;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
    std::__cxx11::wstring::operator=((wstring *)&this->open_array_bracket_str_,(wstring *)local_78);
    std::__cxx11::wstring::~wstring((wstring *)local_78);
    local_94 = 0x5d00000020;
    local_78[0] = local_68;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_78,&local_94);
    std::__cxx11::wstring::operator=((wstring *)&this->close_array_bracket_str_,(wstring *)local_78)
    ;
    std::__cxx11::wstring::~wstring((wstring *)local_78);
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }